

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalNinjaGenerator::WriteNinjaRequiredVersion(cmLocalNinjaGenerator *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  string requiredVersion;
  allocator local_51;
  string local_50;
  string local_30 [32];
  
  cmGlobalNinjaGenerator::RequiredNinjaVersion_abi_cxx11_();
  bVar1 = cmGlobalNinjaGenerator::SupportsConsolePool
                    ((cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator);
  if (bVar1) {
    cmGlobalNinjaGenerator::RequiredNinjaVersionForConsolePool_abi_cxx11_();
    std::__cxx11::string::operator=(local_30,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string
            ((string *)&local_50,"Minimal version of Ninja required by this file",&local_51);
  cmGlobalNinjaGenerator::WriteComment(os,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  poVar2 = std::operator<<(os,"ninja_required_version = ");
  poVar2 = std::operator<<(poVar2,local_30);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaRequiredVersion(std::ostream& os)
{
  // Default required version
  std::string requiredVersion =
      this->GetGlobalNinjaGenerator()->RequiredNinjaVersion();

  // Ninja generator uses the 'console' pool if available (>= 1.5)
  if(this->GetGlobalNinjaGenerator()->SupportsConsolePool())
    {
    requiredVersion =
      this->GetGlobalNinjaGenerator()->RequiredNinjaVersionForConsolePool();
    }

  cmGlobalNinjaGenerator::WriteComment(os,
                          "Minimal version of Ninja required by this file");
  os
    << "ninja_required_version = "
    << requiredVersion
    << std::endl << std::endl
    ;
}